

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O3

size_t __thiscall
axl::enc::CharCodec::encode_utf16
          (CharCodec *this,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,StringRef_utf16 *string
          ,utf32_t replacement)

{
  C *pCVar1;
  size_t sVar2;
  C *pCVar3;
  long lVar4;
  undefined1 auVar5 [16];
  char tmpBuffer [256];
  StringRefBase<short,_axl::sl::StringDetailsBase<short>_> local_158;
  char local_138 [264];
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(buffer,0);
  if (0 < (long)string->m_length) {
    pCVar3 = string->m_p;
    pCVar1 = pCVar3 + string->m_length;
    do {
      lVar4 = (long)pCVar1 - (long)pCVar3;
      local_158.m_length._0_1_ = 0;
      local_158.m_length._1_7_ = 0;
      local_158.m_isNullTerminated = false;
      local_158.m_p = (C *)0x0;
      local_158.m_hdr._0_1_ = 0;
      local_158.m_hdr._1_7_ = 0;
      sl::StringRefBase<short,_axl::sl::StringDetailsBase<short>_>::attachBufHdr
                (&local_158,(BufHdr *)0x0);
      local_158.m_length._0_1_ = (undefined1)(lVar4 >> 1);
      local_158.m_length._1_7_ = (int7)(lVar4 >> 9);
      local_158.m_isNullTerminated = false;
      local_158.m_p = pCVar3;
      auVar5 = (**(code **)(*(long *)this + 0x38))(this,local_138,0x100,&local_158,replacement);
      sl::StringRefBase<short,_axl::sl::StringDetailsBase<short>_>::release(&local_158);
      if (auVar5._8_8_ == 0) break;
      sVar2 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                        (buffer,0xffffffffffffffff,local_138,auVar5._0_8_);
      if (sVar2 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      pCVar3 = pCVar3 + auVar5._8_8_;
    } while (pCVar3 < pCVar1);
  }
  return (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
}

Assistant:

size_t
CharCodec::encode_utf16(
	sl::Array<char>* buffer,
	const sl::StringRef_utf16& string,
	utf32_t replacement
) {
	buffer->clear();

	const utf16_t* p = string.cp();
	const utf16_t* end = string.getEnd();
	while (p < end) {
		char tmpBuffer[256];
		ConvertLengthResult result = encode_utf16(
			tmpBuffer,
			sizeof(tmpBuffer),
			sl::StringRef_utf16(p, end - p),
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t size = buffer->append(tmpBuffer, result.m_dstLength);
		if (size == -1)
			return -1;

		p += result.m_srcLength;
	}

	return buffer->getCount();
}